

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

string * __thiscall
Utils::getClsidType_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  size_type *psVar4;
  string local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  iVar3 = std::__cxx11::string::compare((char *)clsid_list);
  if (iVar3 != 0) {
    psVar4 = &clsid_list[0].name._M_string_length;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,psVar4[-5],psVar4[-4] + psVar4[-5]);
      bVar2 = compareClsidType(&local_48,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (((string *)(psVar4 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar4);
        return __return_storage_ptr__;
      }
      iVar3 = std::__cxx11::string::compare((char *)(psVar4 + 3));
      psVar4 = psVar4 + 8;
    } while (iVar3 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Not found","");
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getClsidType(std::vector<unsigned int> vec) {
    for (int i = 0; clsid_list[i].clsid != GUID_Unknown; i++) {
        if (compareClsidType(vec, clsid_list[i].clsid)) {
            return clsid_list[i].name;
        }
    }
    return "Not found";
}